

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O1

int read_asn1_length(uchar *data,size_t datalen,size_t *len)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  if (datalen != 0) {
    bVar1 = *data;
    *len = (ulong)bVar1;
    uVar3 = 0;
    if ((char)bVar1 < '\0') {
      uVar3 = bVar1 & 0x7f;
      bVar1 = data[1];
      *len = (ulong)bVar1;
      if (datalen < (ulong)uVar3 + 1) {
        return -1;
      }
      if (1 < (byte)uVar3) {
        *len = (ulong)bVar1 << 8;
        *len = (ulong)CONCAT11(bVar1,data[2]);
      }
    }
    if (uVar3 < 3) {
      iVar2 = -1;
      if ((ulong)uVar3 + *len + 1 <= datalen) {
        iVar2 = uVar3 + 1;
      }
      return iVar2;
    }
  }
  return -1;
}

Assistant:

static int
read_asn1_length(const unsigned char *data,
                 size_t datalen, size_t *len)
{
    unsigned int lenlen;
    int nextpos;

    if(datalen < 1) {
        return -1;
    }
    *len = data[0];

    if(*len >= 0x80) {
        lenlen = *len & 0x7F;
        *len = data[1];
        if(1 + lenlen > datalen) {
            return -1;
        }
        if(lenlen > 1) {
            *len <<= 8;
            *len |= data[2];
        }
    }
    else {
        lenlen = 0;
    }

    nextpos = 1 + lenlen;
    if(lenlen > 2 || 1 + lenlen + *len > datalen) {
        return -1;
    }

    return nextpos;
}